

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy.c
# Opt level: O2

int mbedtls_entropy_func(void *data,uchar *output,size_t len)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  mbedtls_md_info_t *pmVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  uchar auStack_68 [8];
  uchar buf [32];
  
  if (len < 0x21) {
    uVar10 = 0;
    iVar7 = 0;
    do {
      iVar2 = -0x3c;
      if ((iVar7 == 0x101) ||
         (iVar2 = entropy_gather_internal((mbedtls_entropy_context *)data), iVar2 != 0))
      goto LAB_001e5723;
      iVar7 = iVar7 + 1;
      uVar3 = (ulong)*(uint *)((long)data + 0x1c);
      if ((int)*(uint *)((long)data + 0x1c) < 1) {
        uVar3 = uVar10;
      }
      uVar6 = 1;
      uVar4 = 0;
      for (lVar8 = 0; uVar3 * 0x28 - lVar8 != 0; lVar8 = lVar8 + 0x28) {
        uVar9 = *(ulong *)((long)data + lVar8 + 0x30);
        if (uVar9 < *(ulong *)((long)data + lVar8 + 0x38)) {
          uVar6 = uVar10;
        }
        if (*(int *)((long)data + lVar8 + 0x40) != 1) {
          uVar9 = uVar10;
        }
        uVar4 = uVar4 + uVar9;
      }
    } while (((int)uVar6 == 0) || (uVar4 < 0x20));
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    buf[0x10] = '\0';
    buf[0x11] = '\0';
    buf[0x12] = '\0';
    buf[0x13] = '\0';
    buf[0x14] = '\0';
    buf[0x15] = '\0';
    buf[0x16] = '\0';
    buf[0x17] = '\0';
    auStack_68[0] = '\0';
    auStack_68[1] = '\0';
    auStack_68[2] = '\0';
    auStack_68[3] = '\0';
    auStack_68[4] = '\0';
    auStack_68[5] = '\0';
    auStack_68[6] = '\0';
    auStack_68[7] = '\0';
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    iVar2 = mbedtls_md_finish((mbedtls_md_context_t *)data,auStack_68);
    if (iVar2 == 0) {
      mbedtls_md_free((mbedtls_md_context_t *)data);
      mbedtls_md_init((mbedtls_md_context_t *)data);
      pmVar5 = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
      iVar2 = mbedtls_md_setup((mbedtls_md_context_t *)data,pmVar5,0);
      if (((iVar2 == 0) && (iVar2 = mbedtls_md_starts((mbedtls_md_context_t *)data), iVar2 == 0)) &&
         (iVar2 = mbedtls_md_update((mbedtls_md_context_t *)data,auStack_68,0x20), iVar2 == 0)) {
        pmVar5 = mbedtls_md_info_from_type(MBEDTLS_MD_SHA256);
        iVar2 = mbedtls_md(pmVar5,auStack_68,0x20,auStack_68);
        if (iVar2 == 0) {
          lVar8 = 0;
          uVar1 = *(uint *)((long)data + 0x1c);
          if ((int)*(uint *)((long)data + 0x1c) < 1) {
            uVar1 = 0;
          }
          for (; (ulong)uVar1 * 0x28 - lVar8 != 0; lVar8 = lVar8 + 0x28) {
            *(undefined8 *)((long)data + lVar8 + 0x30) = 0;
          }
          memcpy(output,auStack_68,len);
          iVar2 = 0;
        }
      }
    }
LAB_001e5723:
    mbedtls_platform_zeroize(auStack_68,0x20);
  }
  else {
    iVar2 = -0x3c;
  }
  return iVar2;
}

Assistant:

int mbedtls_entropy_func(void *data, unsigned char *output, size_t len)
{
    int ret, count = 0, i, thresholds_reached;
    size_t strong_size;
    mbedtls_entropy_context *ctx = (mbedtls_entropy_context *) data;
    unsigned char buf[MBEDTLS_ENTROPY_BLOCK_SIZE];

    if (len > MBEDTLS_ENTROPY_BLOCK_SIZE) {
        return MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
    }

#if defined(MBEDTLS_ENTROPY_NV_SEED)
    /* Update the NV entropy seed before generating any entropy for outside
     * use.
     */
    if (ctx->initial_entropy_run == 0) {
        ctx->initial_entropy_run = 1;
        if ((ret = mbedtls_entropy_update_nv_seed(ctx)) != 0) {
            return ret;
        }
    }
#endif

#if defined(MBEDTLS_THREADING_C)
    if ((ret = mbedtls_mutex_lock(&ctx->mutex)) != 0) {
        return ret;
    }
#endif

    /*
     * Always gather extra entropy before a call
     */
    do {
        if (count++ > ENTROPY_MAX_LOOP) {
            ret = MBEDTLS_ERR_ENTROPY_SOURCE_FAILED;
            goto exit;
        }

        if ((ret = entropy_gather_internal(ctx)) != 0) {
            goto exit;
        }

        thresholds_reached = 1;
        strong_size = 0;
        for (i = 0; i < ctx->source_count; i++) {
            if (ctx->source[i].size < ctx->source[i].threshold) {
                thresholds_reached = 0;
            }
            if (ctx->source[i].strong == MBEDTLS_ENTROPY_SOURCE_STRONG) {
                strong_size += ctx->source[i].size;
            }
        }
    } while (!thresholds_reached || strong_size < MBEDTLS_ENTROPY_BLOCK_SIZE);

    memset(buf, 0, MBEDTLS_ENTROPY_BLOCK_SIZE);

    /*
     * Note that at this stage it is assumed that the accumulator was started
     * in a previous call to entropy_update(). If this is not guaranteed, the
     * code below will fail.
     */
    if ((ret = mbedtls_md_finish(&ctx->accumulator, buf)) != 0) {
        goto exit;
    }

    /*
     * Reset accumulator and counters and recycle existing entropy
     */
    mbedtls_md_free(&ctx->accumulator);
    mbedtls_md_init(&ctx->accumulator);
    ret = mbedtls_md_setup(&ctx->accumulator,
                           mbedtls_md_info_from_type(MBEDTLS_ENTROPY_MD), 0);
    if (ret != 0) {
        goto exit;
    }
    ret = mbedtls_md_starts(&ctx->accumulator);
    if (ret != 0) {
        goto exit;
    }
    if ((ret = mbedtls_md_update(&ctx->accumulator, buf,
                                 MBEDTLS_ENTROPY_BLOCK_SIZE)) != 0) {
        goto exit;
    }

    /*
     * Perform second hashing on entropy
     */
    if ((ret = mbedtls_md(mbedtls_md_info_from_type(MBEDTLS_ENTROPY_MD),
                          buf, MBEDTLS_ENTROPY_BLOCK_SIZE, buf)) != 0) {
        goto exit;
    }

    for (i = 0; i < ctx->source_count; i++) {
        ctx->source[i].size = 0;
    }

    memcpy(output, buf, len);

    ret = 0;

exit:
    mbedtls_platform_zeroize(buf, sizeof(buf));

#if defined(MBEDTLS_THREADING_C)
    if (mbedtls_mutex_unlock(&ctx->mutex) != 0) {
        return MBEDTLS_ERR_THREADING_MUTEX_ERROR;
    }
#endif

    return ret;
}